

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int create_course(course *course,course_strings *data)

{
  uchar *puVar1;
  uchar *puVar2;
  byte *pbVar3;
  ushort *puVar4;
  char cVar5;
  int iVar6;
  subject_area sVar7;
  class_type cVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  _Bool *p_Var14;
  int val;
  byte local_42;
  char start_merid;
  char *local_40;
  ushort **local_38;
  
  course->course_name = data->course_name;
  course->co_requisites = data->co_requisites;
  course->instructor = data->instructor;
  course->pre_requisites = data->pre_requisites;
  course->course_id = data->course_id;
  iVar6 = parse_int(&val,data->units);
  if (iVar6 != 0) {
    return -1;
  }
  course->units = (uchar)val;
  iVar6 = parse_int(&val,data->max_enroll);
  if (iVar6 != 0) {
    return -1;
  }
  course->max_enrollment = (unsigned_short)val;
  pcVar12 = data->final_exam;
  puVar1 = &(course->final_exam_date).start_hour;
  puVar2 = &(course->final_exam_date).end_hour;
  iVar6 = __isoc99_sscanf(pcVar12," %2hhu/%2hhu/%4hu %2hhu:%2hhu%1c.M. - %2hhu:%2hhu:%2hhu%1c.M. ",
                          &course->final_exam_date,&(course->final_exam_date).day,
                          &(course->final_exam_date).year,puVar1,
                          &(course->final_exam_date).start_minute,&start_merid,puVar2,
                          &(course->final_exam_date).end_minute,&local_42);
  if (iVar6 == -1) {
    return -1;
  }
  if ((start_merid & 0xdfU) == 0x50) {
    *puVar1 = *puVar1 + '\f';
  }
  if ((local_42 & 0xdf) == 0x50) {
    *puVar2 = *puVar2 + '\f';
  }
  pcVar13 = data->course_id;
  local_40 = (char *)malloc((size_t)pcVar12);
  if (local_40 == (char *)0x0) {
    return -1;
  }
  local_38 = __ctype_b_loc();
  puVar4 = *local_38;
  pcVar13 = pcVar13 + -1;
  do {
    pcVar12 = pcVar13 + 1;
    uVar9 = (ulong)*pcVar12;
    pcVar13 = pcVar13 + 1;
  } while ((*(byte *)((long)puVar4 + uVar9 * 2 + 1) & 0x20) != 0);
  pcVar10 = local_40;
  if (*pcVar12 != '\0') {
    while (cVar5 = (char)uVar9, cVar5 != '\0') {
      if ((puVar4[cVar5] & 8) == 0) goto LAB_0010510b;
      *pcVar10 = cVar5;
      pbVar3 = (byte *)(pcVar13 + 1);
      pcVar13 = pcVar13 + 1;
      pcVar10 = pcVar10 + 1;
      uVar9 = (ulong)*pbVar3;
    }
  }
  goto LAB_00105152;
LAB_0010510b:
  do {
    cVar5 = *pcVar13;
    uVar9 = (ulong)cVar5;
    pcVar13 = pcVar13 + 1;
  } while ((*(byte *)((long)puVar4 + uVar9 * 2 + 1) & 0x20) != 0);
  if ((cVar5 != '\0') &&
     (pcVar10 = (char *)malloc((size_t)local_40), pcVar12 = local_40, pcVar10 != (char *)0x0)) {
    lVar11 = 0;
    while ((cVar5 = (char)uVar9, cVar5 != '\0' && ((puVar4[cVar5] & 8) != 0))) {
      pcVar10[lVar11] = cVar5;
      uVar9 = (ulong)(byte)pcVar13[lVar11];
      lVar11 = lVar11 + 1;
    }
    sVar7 = parse_subject_area(local_40);
    course->subject_area = sVar7;
    course->course_number = pcVar10;
    free(pcVar12);
    cVar8 = parse_class_type(data->class_type);
    course->class_type = cVar8;
    pcVar12 = data->days;
    course->days[0] = false;
    course->days[1] = false;
    course->days[2] = false;
    course->days[3] = false;
    course->days[4] = false;
    course->days[5] = false;
    do {
      cVar5 = *pcVar12;
      p_Var14 = course->days;
      switch(cVar5) {
      case 'M':
        break;
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'U':
      case 'V':
switchD_001051ce_caseD_4e:
        if ((*(byte *)((long)*local_38 + (long)cVar5 * 2 + 1) & 0x20) == 0) {
          return -1;
        }
        goto LAB_0010520b;
      case 'R':
        p_Var14 = course->days + 3;
        break;
      case 'S':
        p_Var14 = course->days + 5;
        break;
      case 'T':
        p_Var14 = course->days + 1;
        break;
      case 'W':
        p_Var14 = course->days + 2;
        break;
      default:
        p_Var14 = course->days + 4;
        if (cVar5 != 'F') {
          if (cVar5 == '\0') {
            iVar6 = parse_times(course,data->times);
            if (iVar6 != 0) {
              return -1;
            }
            iVar6 = parse_int(&val,data->available_seats);
            if (iVar6 != 0) {
              return -1;
            }
            course->available_seats = (unsigned_short)val;
            iVar6 = parse_course_status(&course->status,data->course_status);
            if (iVar6 != 0) {
              return -1;
            }
            iVar6 = parse_int(&val,data->section_number);
            if (iVar6 != 0) {
              return -1;
            }
            course->section = (unsigned_short)val;
            iVar6 = parse_int(&val,data->call_number);
            if (iVar6 != 0) {
              return -1;
            }
            course->call_number = val;
            return 0;
          }
          goto switchD_001051ce_caseD_4e;
        }
      }
      *p_Var14 = true;
LAB_0010520b:
      pcVar12 = pcVar12 + 1;
    } while( true );
  }
LAB_00105152:
  free(local_40);
  return -1;
}

Assistant:

int create_course(struct course *course, const struct course_strings *data)
{
	int val, ret;

	course->course_name = data->course_name;
	course->co_requisites = data->co_requisites;
	course->instructor = data->instructor;
	course->pre_requisites = data->pre_requisites;
	course->course_id = data->course_id;

	ret = parse_int(&val, data->units);
	if (ret) return -1;
	course->units = val;

	ret = parse_int(&val, data->max_enroll);
	if (ret) return -1;
	course->max_enrollment = val;

	ret = parse_final_exam(course, data->final_exam);
	if (ret) return -1;

	ret = parse_course_id(&course->subject_area, &course->course_number, data->course_id);
	if (ret) return -1;

	course->class_type = parse_class_type(data->class_type);

	ret = parse_days(course->days, data->days);
	if (ret) return -1;

	ret = parse_times(course, data->times);
	if (ret) return -1;

	ret = parse_int(&val, data->available_seats);
	if (ret) return -1;
	course->available_seats = val;

	ret = parse_course_status(&course->status, data->course_status);
	if (ret) return -1;

	ret = parse_int(&val, data->section_number);
	if (ret) return -1;
	course->section = val;

	ret = parse_int(&val, data->call_number);
	if (ret) return -1;
	course->call_number = val;

	return 0;
}